

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerialArena::SerialArena(SerialArena *this,Block *b,void *owner)

{
  char *pcVar1;
  
  this->space_used_ = 0;
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = b->size;
  this->owner_ = owner;
  this->head_ = b;
  pcVar1 = Block::Pointer(b,0x50);
  this->ptr_ = pcVar1;
  pcVar1 = Block::Pointer(b,b->size & 0xfffffffffffffff8);
  this->limit_ = pcVar1;
  return;
}

Assistant:

SerialArena::SerialArena(Block* b, void* owner) : space_allocated_(b->size) {
  owner_ = owner;
  head_ = b;
  ptr_ = b->Pointer(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize);
  limit_ = b->Pointer(b->size & static_cast<size_t>(-8));
}